

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::TcpConnection::forceCloseWithDelay(TcpConnection *this,double seconds)

{
  _Atomic_word *p_Var1;
  EventLoop *this_00;
  int iVar2;
  WeakCallback<sznet::net::TcpConnection> local_80;
  _Any_data local_50;
  code *local_40;
  __shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  double local_20;
  
  if ((this->m_state & ~kConnecting) == kConnected) {
    this->m_state = kDisconnecting;
    this_00 = this->m_loop;
    local_20 = seconds;
    std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::TcpConnection,void>
              (local_30,(__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    makeWeakCallback<sznet::net::TcpConnection>
              (&local_80,(sznet *)local_30,(shared_ptr<sznet::net::TcpConnection> *)forceClose,0);
    std::function<void()>::function<sznet::WeakCallback<sznet::net::TcpConnection>,void>
              ((function<void()> *)local_50._M_pod_data,&local_80);
    EventLoop::runAfter(this_00,local_20,(TimerCallback *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (local_80.m_function.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_80.m_function.super__Function_base._M_manager)
                ((_Any_data *)&local_80.m_function,(_Any_data *)&local_80.m_function,
                 __destroy_functor);
    }
    if (local_80.m_object.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_80.m_object.
                   super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar2 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar2 = (local_80.m_object.
                 super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_weak_count;
        (local_80.m_object.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
      }
      if (iVar2 == 1) {
        (*(local_80.m_object.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  return;
}

Assistant:

void TcpConnection::forceCloseWithDelay(double seconds)
{
	if (m_state == kConnected || m_state == kDisconnecting)
	{
		setState(kDisconnecting);
		// not forceCloseInLoop to avoid race condition
		m_loop->runAfter(
			seconds,
			makeWeakCallback(shared_from_this(),
				&TcpConnection::forceClose));
	}
}